

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mult.hpp
# Opt level: O3

void calc_mean_and_sd_weighted<float,int,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>,long_double>
               (size_t *ix_arr,size_t st,size_t end,size_t col_num,float *Xc,int *Xc_ind,
               int *Xc_indptr,double *x_sd,double *x_mean,
               robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
               *w)

{
  int *piVar1;
  int iVar2;
  float *pfVar3;
  size_t *psVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  int *piVar9;
  long lVar10;
  ulong *puVar11;
  long lVar12;
  ulong *key;
  int *piVar13;
  size_t row;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble lVar14;
  longdouble lVar15;
  double dVar16;
  pair<tsl::detail_robin_hash::robin_hash<std::pair<unsigned_long,_double>,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::robin_iterator<false>,_bool>
  pVar17;
  tuple<> local_d9;
  _Head_base<0UL,_const_unsigned_long_&,_false> local_d8;
  longdouble local_d0;
  longdouble local_c0;
  int *local_b0;
  ulong *local_a8;
  longdouble local_a0;
  longdouble local_94;
  int *local_88;
  size_t *local_80;
  long local_78;
  float *local_70;
  ulong local_68;
  longdouble local_54;
  longdouble local_48;
  longdouble local_3c;
  
  lVar10 = (long)Xc_indptr[col_num];
  lVar12 = (long)Xc_indptr[col_num + 1];
  if (Xc_indptr[col_num] == Xc_indptr[col_num + 1]) {
    *x_sd = 0.0;
    *x_mean = 0.0;
    return;
  }
  puVar11 = ix_arr + st;
  local_a0 = (longdouble)CONCAT28(local_a0._8_2_,ix_arr);
  local_a8 = ix_arr + end + 1;
  uVar5 = (long)local_a8 - (long)puVar11 >> 3;
  key = puVar11;
  if (0 < (long)uVar5) {
    do {
      uVar6 = uVar5 >> 1;
      uVar7 = ~uVar6 + uVar5;
      uVar5 = uVar6;
      if (key[uVar6] < (ulong)(long)Xc_ind[lVar10]) {
        key = key + uVar6 + 1;
        uVar5 = uVar7;
      }
    } while (0 < (long)uVar5);
  }
  local_c0 = (longdouble)CONCAT28(local_c0._8_2_,lVar10);
  local_d0 = (longdouble)CONCAT28(local_d0._8_2_,lVar12);
  local_68 = (ulong)Xc_ind[lVar12 + -1];
  local_94 = (longdouble)0;
  local_b0 = Xc_ind;
  local_70 = Xc;
  psVar4 = ix_arr;
  if (st <= end) {
    local_94 = (longdouble)0;
    do {
      local_d8._M_head_impl = puVar11;
      pVar17 = tsl::detail_robin_hash::
               robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
               ::
               insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                         ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                           *)w,puVar11,(piecewise_construct_t *)&std::piecewise_construct,
                          (tuple<const_unsigned_long_&> *)&local_d8,&local_d9);
      local_94 = local_94 + (longdouble)*(double *)((pVar17.first.m_bucket.m_bucket)->m_value + 8);
      st = st + 1;
      puVar11 = puVar11 + 1;
      lVar10 = local_c0._0_8_;
      lVar12 = local_d0._0_8_;
      psVar4 = local_a0._0_8_;
    } while (st <= end);
  }
  local_a0._0_8_ = psVar4;
  local_d0._0_8_ = lVar12;
  local_c0._0_8_ = lVar10;
  pfVar3 = local_70;
  lVar10 = local_d0._0_8_;
  if ((key != local_a8) && (local_78 = local_d0._0_8_ + -1, local_d0._0_8_ != local_c0._0_8_)) {
    local_88 = local_b0 + local_d0._0_8_;
    local_80 = local_a0._0_8_ + end;
    local_a0 = (longdouble)0;
    lVar12 = local_c0._0_8_;
    piVar9 = local_b0;
    puVar11 = local_a8;
    local_c0 = local_a0;
    local_d0 = local_a0;
    while (uVar5 = *key, uVar5 <= local_68) {
      piVar1 = piVar9 + lVar12;
      iVar2 = *piVar1;
      if (iVar2 == (int)uVar5) {
        local_d8._M_head_impl = key;
        if ((uint)ABS(pfVar3[lVar12]) < 0x7f800000) {
          pVar17 = tsl::detail_robin_hash::
                   robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                   ::
                   insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                             ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                               *)w,key,(piecewise_construct_t *)&std::piecewise_construct,
                              (tuple<const_unsigned_long_&> *)&local_d8,&local_d9);
          local_54 = (longdouble)pfVar3[lVar12];
          local_3c = local_54;
          if (local_d0 != (longdouble)0) {
            local_3c = local_c0;
          }
          if (NAN(local_d0) || NAN((longdouble)0)) {
            local_3c = local_c0;
          }
          local_48 = (longdouble)*(double *)((pVar17.first.m_bucket.m_bucket)->m_value + 8);
          local_d0 = local_d0 + local_48;
          lVar14 = in_ST2;
          lVar15 = in_ST2;
          fmal();
          local_c0 = in_ST0;
          fmal();
          local_a0 = in_ST1;
          in_ST0 = in_ST2;
          in_ST1 = lVar14;
          in_ST2 = lVar15;
        }
        else {
          pVar17 = tsl::detail_robin_hash::
                   robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                   ::
                   insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                             ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                               *)w,key,(piecewise_construct_t *)&std::piecewise_construct,
                              (tuple<const_unsigned_long_&> *)&local_d8,&local_d9);
          local_94 = local_94 -
                     (longdouble)*(double *)((pVar17.first.m_bucket.m_bucket)->m_value + 8);
        }
        if ((key == local_80) || (lVar12 == local_78)) break;
        piVar13 = piVar1 + 1;
        key = key + 1;
        uVar5 = (long)local_88 - (long)piVar13 >> 2;
        piVar9 = local_b0;
        puVar11 = local_a8;
        if (0 < (long)uVar5) {
          do {
            uVar6 = uVar5 >> 1;
            uVar7 = ~uVar6 + uVar5;
            uVar5 = uVar6;
            if ((ulong)(long)(piVar13 + uVar6 + 1)[-1] < *key) {
              piVar13 = piVar13 + uVar6 + 1;
              uVar5 = uVar7;
            }
          } while (0 < (long)uVar5);
        }
LAB_0028ad1c:
        lVar12 = (long)piVar13 - (long)piVar9 >> 2;
      }
      else {
        if (iVar2 <= (int)uVar5) {
          piVar13 = piVar1 + 1;
          uVar6 = (long)local_88 - (long)(piVar1 + 1) >> 2;
          while (0 < (long)uVar6) {
            uVar7 = uVar6 >> 1;
            uVar8 = ~uVar7 + uVar6;
            uVar6 = uVar7;
            if ((ulong)(long)(piVar13 + uVar7 + 1)[-1] < uVar5) {
              piVar13 = piVar13 + uVar7 + 1;
              uVar6 = uVar8;
            }
          }
          goto LAB_0028ad1c;
        }
        key = key + 1;
        uVar5 = (long)puVar11 - (long)key >> 3;
        while (0 < (long)uVar5) {
          uVar6 = uVar5 >> 1;
          uVar7 = ~uVar6 + uVar5;
          uVar5 = uVar6;
          if (key[uVar6] < (ulong)(long)iVar2) {
            key = key + uVar6 + 1;
            uVar5 = uVar7;
          }
        }
      }
      if ((key == puVar11) || (lVar12 == lVar10)) break;
    }
    if ((local_d0 != (longdouble)0) || (NAN(local_d0) || NAN((longdouble)0))) {
      if (local_d0 < local_94) {
        local_a0 = local_c0 * local_c0 * ((longdouble)1 - local_d0 / local_94) * local_d0 + local_a0
        ;
        local_c0 = local_c0 * (local_d0 / local_94);
      }
      *x_mean = (double)local_c0;
      dVar16 = (double)SQRT(local_a0 / local_94);
      goto LAB_0028ad9c;
    }
  }
  *x_mean = 0.0;
  dVar16 = 0.0;
LAB_0028ad9c:
  *x_sd = dVar16;
  return;
}

Assistant:

void calc_mean_and_sd_weighted(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
                               real_t_ *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                               double &restrict x_sd, double &restrict x_mean, mapping &restrict w)
{
    /* ix_arr must be already sorted beforehand */
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
    {
        x_sd   = 0;
        x_mean = 0;
        return;
    }
    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = (size_t) Xc_ind[end_col];
    size_t *ptr_st = std::lower_bound(ix_arr + st, ix_arr + end + 1, (size_t)Xc_ind[st_col]);

    ldouble_safe cnt = 0.;
    for (size_t row = st; row <= end; row++)
        cnt += w[ix_arr[row]];
    ldouble_safe added = 0;
    ldouble_safe m = 0;
    ldouble_safe s = 0;
    ldouble_safe m_prev = 0;
    ldouble_safe w_this;

    for (size_t *row = ptr_st;
         row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
        )
    {
        if (Xc_ind[curr_pos] == (sparse_ix)(*row))
        {
            if (unlikely(is_na_or_inf(Xc[curr_pos])))
            {
                cnt -= w[*row];
            }

            else
            {
                w_this = w[*row];
                if (added == 0) m_prev = Xc[curr_pos];
                added += w_this;
                m = std::fma(w_this, (Xc[curr_pos] - m) / added, m);
                s = std::fma(w_this, (Xc[curr_pos] - m) * (Xc[curr_pos] - m_prev), s);
                m_prev = m;
            }

            if (row == ix_arr + end || curr_pos == end_col) break;
            curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
        }

        else
        {
            if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
            else
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
        }
    }

    if (added == 0)
    {
        x_mean = 0;
        x_sd = 0;
        return;
    }

    /* Note: up to this point:
         m = sum(x)/nnz
         s = sum(x^2) - (1/nnz)*(sum(x)^2)
       Here the standard deviation is given by:
         sigma = (1/n)*(sum(x^2) - (1/n)*(sum(x)^2))
       The difference can be put to a closed form. */
    if (cnt > added)
    {
        s += square(m) * (added * ((ldouble_safe)1 - (ldouble_safe)added/(ldouble_safe)cnt));
        m *= added / cnt;
    }

    x_mean = m;
    x_sd   = std::sqrt(s / (ldouble_safe)cnt);
}